

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

double __thiscall asl::Log::log(Log *this,double __x)

{
  bool bVar1;
  pthread_mutex_t *__mutex;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  Long LVar5;
  int *piVar6;
  int iVar7;
  int *in_RCX;
  char *pcVar8;
  uint in_EDX;
  int *piVar9;
  String *in_RSI;
  anon_union_16_2_78e7fdac_for_String_2 *paVar10;
  undefined8 uVar11;
  uint uVar12;
  int i;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar13;
  String line;
  String oldfile;
  String logfile;
  String catg;
  Date now;
  String local_138;
  int *local_120;
  String local_118;
  String local_100;
  undefined1 local_e8 [32];
  Long local_c8;
  undefined1 local_a0 [24];
  String local_88;
  Date local_70;
  String local_68;
  Path local_50;
  Date local_38;
  
  updateState(this);
  dVar13 = extraout_XMM0_Qa;
  if ((int)in_EDX <= this->_maxLevel) {
    Date::now();
    if (in_RSI->_size == 0) {
      paVar10 = &in_RSI->field_2;
    }
    else {
      paVar10 = (anon_union_16_2_78e7fdac_for_String_2 *)(in_RSI->field_2)._str;
    }
    local_120 = in_RCX;
    pcVar4 = strrchr(paVar10->_space,0x5c);
    iVar7 = (int)paVar10;
    uVar12 = -(uint)(pcVar4 == (char *)0x0) | (int)pcVar4 - iVar7;
    pcVar4 = strrchr(paVar10->_space,0x2f);
    uVar3 = -(uint)(pcVar4 == (char *)0x0) | (int)pcVar4 - iVar7;
    if ((int)uVar3 < (int)uVar12) {
      uVar3 = uVar12;
    }
    i = uVar3 + 1;
    if ((int)uVar3 < 0) {
      i = 0;
    }
    pcVar4 = strrchr(paVar10->_space,0x2e);
    iVar7 = (int)pcVar4 - iVar7;
    if (iVar7 < 0) {
      iVar7 = in_RSI->_len;
    }
    if (pcVar4 == (char *)0x0) {
      iVar7 = in_RSI->_len;
    }
    String::substring(&local_88,in_RSI,i,iVar7);
    bVar1 = this->_useconsole;
    __mutex = (pthread_mutex_t *)this->_mutex;
    pthread_mutex_lock(__mutex);
    iVar7 = (this->_logfile)._len;
    String::alloc(&local_100,iVar7);
    uVar11 = local_100.field_2._str;
    if (local_100._size == 0) {
      uVar11 = &local_100.field_2;
    }
    if ((this->_logfile)._size == 0) {
      paVar10 = &(this->_logfile).field_2;
    }
    else {
      paVar10 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_logfile).field_2._str;
    }
    local_100._len = iVar7;
    memcpy((void *)uVar11,paVar10,(long)iVar7 + 1);
    if (this->_usefile == true) {
      File::File((File *)local_e8,&local_100);
      LVar5 = File::size((File *)local_e8);
      File::~File((File *)local_e8);
      if (1000000 < LVar5) {
        Path::Path((Path *)&local_138,&local_100);
        Path::noExt(&local_50,(Path *)&local_138);
        Path::operator+((Path *)local_a0,&local_50,"-1.");
        Path::extension(&local_68,(Path *)&local_138);
        Path::operator+((Path *)local_e8,(Path *)local_a0,&local_68);
        String::alloc(&local_118,local_e8._4_4_);
        local_118._len = local_e8._4_4_;
        uVar11 = local_118.field_2._str;
        if (local_118._size == 0) {
          uVar11 = &local_118.field_2;
        }
        pcVar4 = (char *)local_e8._8_8_;
        if (local_e8._0_4_ == 0) {
          pcVar4 = local_e8 + 8;
        }
        memcpy((void *)uVar11,pcVar4,(long)(int)local_e8._4_4_ + 1);
        if (local_e8._0_4_ != 0) {
          free((void *)local_e8._8_8_);
        }
        if (local_68._size != 0) {
          free(local_68.field_2._str);
        }
        if (local_a0._0_4_ != 0) {
          free((void *)local_a0._8_8_);
        }
        if (local_50._path._size != 0) {
          free(local_50._path.field_2._str);
        }
        File::File((File *)local_e8,&local_118);
        local_c8 = -1;
        File::creationDate((File *)local_a0);
        local_70._t = (double)CONCAT44(local_a0._4_4_,local_a0._0_4_);
        File::~File((File *)local_e8);
        if ((local_70._t != 0.0) || (NAN(local_70._t))) {
          Directory::remove((char *)&local_118);
        }
        Directory::move(&local_100,&local_118);
        if (local_118._size != 0) {
          free(local_118.field_2._str);
        }
        if (local_138._size != 0) {
          free(local_138.field_2._str);
        }
      }
    }
    pcVar4 = "";
    if ((in_EDX < 5) && ((0x1bU >> (in_EDX & 0x1f) & 1) != 0)) {
      pcVar4 = (&PTR_anon_var_dwarf_98095_00150c28)[in_EDX];
      bVar2 = true;
      if (bVar1 != false) {
        Console::color((Console *)&console,*(Color *)(&DAT_00141190 + (ulong)in_EDX * 4));
      }
    }
    else {
      bVar2 = false;
    }
    Date::toString((String *)local_e8,&local_38,LONG,false);
    pcVar8 = (char *)local_e8._8_8_;
    if (local_e8._0_4_ == 0) {
      pcVar8 = local_e8 + 8;
    }
    uVar11 = local_88.field_2._str;
    if (local_88._size == 0) {
      uVar11 = &local_88.field_2;
    }
    piVar9 = local_120 + 2;
    piVar6 = piVar9;
    if (*local_120 != 0) {
      piVar6 = *(int **)(local_120 + 2);
    }
    String::String(&local_138,0,"[%s][%s] %s%s\n",pcVar8,uVar11,pcVar4,piVar6);
    if (local_e8._0_4_ != 0) {
      free((void *)local_e8._8_8_);
    }
    if (0 < (long)local_120[1]) {
      if (*local_120 != 0) {
        piVar9 = *(int **)(local_120 + 2);
      }
      if (*(char *)((long)piVar9 + (long)local_120[1] + -1) == '\n') {
        String::resize(&local_138,local_138._len + -1,true,true);
      }
    }
    if (this->_usefile == true) {
      File::File((File *)local_e8,&this->_logfile);
      TextFile::append((TextFile *)local_e8,&local_138);
      File::~File((File *)local_e8);
    }
    if ((bVar1 != false) && (printf("%s"), bVar2)) {
      Console::color((Console *)&console,COLOR_DEFAULT);
    }
    if (local_138._size != 0) {
      free(local_138.field_2._str);
    }
    if (local_100._size != 0) {
      free(local_100.field_2._str);
    }
    pthread_mutex_unlock(__mutex);
    dVar13 = extraout_XMM0_Qa_00;
    if (local_88._size != 0) {
      free(local_88.field_2._str);
      dVar13 = extraout_XMM0_Qa_01;
    }
  }
  return dVar13;
}

Assistant:

void Log::log(const String& cat, Log::Level level, const String& message)
{
	updateState();
	if (level > _maxLevel)
		return;

	Date now = Date::now();

	// remove directory and extension, so __FILE__ can be used as category
	int slash = max(cat.lastIndexOf('\\'), cat.lastIndexOf('/'));
	int i0 = (slash<0) ? 0 : slash + 1;
	int dot = cat.lastIndexOf('.');
	int i1 = (dot<0) ? cat.length() : dot;
	String catg = cat.substring(i0, i1);
	bool useconsole = _useconsole;

	Lock lock(*_mutex);

#ifndef __ANDROID_API__
	String logfile = _logfile;
	if (_usefile && TextFile(logfile).size() > ASL_LOG_MAX_SIZE)
	{
		Path   path = logfile;
		String oldfile = path.noExt() + "-1." + path.extension();
		if (File(oldfile).exists())
			Directory::remove(oldfile);
		Directory::move(logfile, oldfile);
	}
#endif

	const char* slevel = "";
	Console::Color color = Console::COLOR_DEFAULT;

	switch (level)
	{
	case Log::WARNING:
		slevel = "WARNING: ";
		color = Console::BYELLOW;
		break;
	case Log::ERR:
		slevel = "ERROR: ";
		color = Console::BRED;
		break;
	case Log::DEBUG:
		color = Console::GREEN;
		break;
	case Log::VERBOSE:
		color = Console::CYAN;
		break;
	default:
		break;
	}

	if (useconsole && color != Console::COLOR_DEFAULT)
		console.color(color);

	String line(0, "[%s][%s] %s%s\n", *now.toString(), *catg, slevel, *message);

	if (message.endsWith('\n'))
		line.resize(line.length() - 1);

	if (_usefile)
		TextFile(_logfile).append(line);

	if (useconsole)
	{
		printf("%s", *line);
		if (color != Console::COLOR_DEFAULT)
			console.color();
	}
}